

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

void __thiscall
mapbox::detail::Earcut<unsigned_int>::earcutLinked(Earcut<unsigned_int> *this,Node *ear,int pass)

{
  Node *__args;
  Node *start;
  iterator iVar1;
  bool bVar2;
  Node *pNVar3;
  
  while( true ) {
    while( true ) {
      if (ear == (Node *)0x0) {
        return;
      }
      pNVar3 = ear;
      if ((pass == 0) && (this->hashing == true)) {
        indexCurve(this,ear);
      }
      do {
        while( true ) {
          __args = ear->prev;
          start = ear->next;
          if (__args == start) {
            return;
          }
          if (this->hashing == true) {
            bVar2 = isEarHashed(this,ear);
          }
          else {
            bVar2 = isEar(this,ear);
          }
          if (bVar2 == false) break;
          iVar1._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar1,&__args->i);
          }
          else {
            *iVar1._M_current = __args->i;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          iVar1._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar1,&ear->i);
          }
          else {
            *iVar1._M_current = ear->i;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          iVar1._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar1,&start->i);
          }
          else {
            *iVar1._M_current = start->i;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          pNVar3 = ear->next;
          pNVar3->prev = ear->prev;
          ear->prev->next = pNVar3;
          pNVar3 = ear->prevZ;
          if (pNVar3 != (Node *)0x0) {
            pNVar3->nextZ = ear->nextZ;
          }
          if (ear->nextZ != (Node *)0x0) {
            ear->nextZ->prevZ = pNVar3;
          }
          ear = start->next;
          pNVar3 = ear;
        }
        ear = start;
      } while (start != pNVar3);
      if (pass != 0) break;
      ear = filterPoints(this,start,(Node *)0x0);
      pass = 1;
    }
    if (pass != 1) break;
    pNVar3 = filterPoints(this,start,(Node *)0x0);
    ear = cureLocalIntersections(this,pNVar3);
    pass = 2;
  }
  if (pass != 2) {
    return;
  }
  splitEarcut(this,start);
  return;
}

Assistant:

void Earcut<N>::earcutLinked(Node* ear, int pass) {
    if (!ear) return;

    // interlink polygon nodes in z-order
    if (!pass && hashing) indexCurve(ear);

    Node* stop = ear;
    Node* prev;
    Node* next;

    int iterations = 0;

    // iterate through ears, slicing them one by one
    while (ear->prev != ear->next) {
        iterations++;
        prev = ear->prev;
        next = ear->next;

        if (hashing ? isEarHashed(ear) : isEar(ear)) {
            // cut off the triangle
            indices.emplace_back(prev->i);
            indices.emplace_back(ear->i);
            indices.emplace_back(next->i);

            removeNode(ear);

            // skipping the next vertice leads to less sliver triangles
            ear = next->next;
            stop = next->next;

            continue;
        }

        ear = next;

        // if we looped through the whole remaining polygon and can't find any more ears
        if (ear == stop) {
            // try filtering points and slicing again
            if (!pass) earcutLinked(filterPoints(ear), 1);

            // if this didn't work, try curing all small self-intersections locally
            else if (pass == 1) {
                ear = cureLocalIntersections(filterPoints(ear));
                earcutLinked(ear, 2);

            // as a last resort, try splitting the remaining polygon into two
            } else if (pass == 2) splitEarcut(ear);

            break;
        }
    }
}